

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O3

void __thiscall OmegaOP::algoChannel(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  double **ppdVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  OmegaOP *pOVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  Costs cost;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  double local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double theV;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  OmegaOP *local_48;
  double *local_40;
  double local_38;
  
  uVar9 = (ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar13 = this->nbStates;
  uVar16 = (ulong)uVar13;
  Costs::Costs(&cost);
  ppdVar5 = preprocessing(this,data);
  this->S12P = ppdVar5;
  uVar17 = (int)uVar9 + 1;
  uVar8 = (ulong)uVar17;
  local_68 = uVar9;
  pvVar6 = operator_new__(uVar8 * 4);
  pvVar7 = operator_new__(uVar8 * 4);
  theV = 0.0;
  local_a0 = 2;
  dVar20 = 0.0;
  local_58 = uVar8;
  if (2 < uVar17) {
    local_88 = (ulong)(uVar13 - 1);
    local_60 = local_88 - 1;
    uVar13 = 1;
    uVar17 = 0;
    local_80 = uVar16;
    local_50 = pvVar6;
    local_48 = this;
    do {
      ppdVar5 = this->Q;
      uVar8 = (ulong)uVar13;
      uVar9 = 0;
      do {
        if (local_88 == uVar9) {
          iVar12 = (int)local_88;
          goto LAB_001077f6;
        }
        ppdVar1 = ppdVar5 + uVar9;
        lVar10 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while (ppdVar5[lVar10][uVar8] <= (*ppdVar1)[uVar8] &&
               (*ppdVar1)[uVar8] != ppdVar5[lVar10][uVar8]);
      iVar12 = (int)uVar9 + -1;
LAB_001077f6:
      *(int *)((long)pvVar6 + uVar8 * 4) = iVar12;
      uVar19 = uVar16 & 0xffffffff;
      uVar9 = local_60;
      do {
        if (uVar9 == 0xffffffffffffffff) {
          uVar13 = 0;
          break;
        }
        lVar10 = uVar9 + 1;
        uVar15 = uVar9 & 0xffffffff;
        uVar13 = (int)uVar19 - 1;
        uVar19 = (ulong)uVar13;
        uVar9 = uVar9 - 1;
      } while (ppdVar5[uVar15][uVar8] <= ppdVar5[lVar10][uVar8] &&
               ppdVar5[lVar10][uVar8] != ppdVar5[uVar15][uVar8]);
      *(uint *)((long)pvVar7 + uVar8 * 4) = uVar13;
      uVar13 = local_a0;
      if ((int)uVar16 != 0) {
        uVar9 = 0;
        do {
          local_98 = 1;
          if (local_a0 < 2) {
            local_9c = 0;
            dVar20 = INFINITY;
            uVar13 = 0;
          }
          else {
            uVar16 = 0;
            local_9c = 0;
            dVar20 = INFINITY;
            local_78 = uVar9;
            do {
              if (local_98 < local_a0 - 1) {
                pdVar2 = *this->S12P;
                pdVar3 = this->S12P[2];
                local_90 = dVar20;
                theV = Costs::vhat(&cost,this->states + uVar9,&local_98,&local_a0,pdVar2 + local_98,
                                   pdVar2 + local_a0,pdVar3 + local_98,pdVar3 + local_a0);
                local_94 = Costs::closestStateIndex(&cost,&theV,this->states,(uint)local_80);
                uVar9 = local_78;
                dVar20 = local_90;
              }
              else {
                local_94 = *(uint *)((long)pvVar6 + (ulong)(local_a0 - 1) * 4);
              }
              uVar8 = (ulong)local_98;
              uVar13 = *(uint *)((long)pvVar6 + uVar8 * 4);
              uVar4 = uVar13;
              if (local_94 < uVar13) {
                uVar4 = local_94;
              }
              uVar14 = *(uint *)((long)pvVar7 + uVar8 * 4);
              if (uVar14 <= local_94) {
                uVar14 = local_94;
              }
              uVar18 = local_9c;
              if (uVar4 < uVar14 + 1) {
                if (local_94 < uVar13) {
                  uVar13 = local_94;
                }
                uVar19 = (ulong)uVar13;
                lVar10 = uVar19 * 8;
                pOVar11 = this;
                do {
                  this = local_48;
                  local_9c = (uint)uVar16;
                  uVar17 = uVar17 + 1;
                  local_38 = *(double *)(*(long *)((long)pOVar11->Q + lVar10) + uVar8 * 8);
                  ppdVar5 = pOVar11->S12P;
                  uVar16 = (ulong)local_a0;
                  local_40 = *ppdVar5 + uVar16;
                  local_90 = dVar20;
                  dVar20 = Costs::slopeCost(&cost,(double *)((long)pOVar11->states + lVar10),
                                            pOVar11->states + uVar9,&local_98,&local_a0,
                                            *ppdVar5 + uVar8,local_40,ppdVar5[1] + uVar8,
                                            ppdVar5[1] + uVar16,ppdVar5[2] + uVar8,
                                            ppdVar5[2] + uVar16);
                  dVar21 = dVar20 + local_38 + this->penalty;
                  uVar8 = (ulong)local_98;
                  if (dVar21 < local_90) {
                    uVar18 = local_98;
                  }
                  uVar16 = (ulong)local_9c;
                  dVar20 = local_90;
                  if (dVar21 < local_90) {
                    uVar16 = uVar19 & 0xffffffff;
                    dVar20 = dVar21;
                  }
                  uVar19 = uVar19 + 1;
                  uVar13 = *(uint *)((long)pvVar7 + uVar8 * 4);
                  if (uVar13 <= local_94) {
                    uVar13 = local_94;
                  }
                  lVar10 = lVar10 + 8;
                  pOVar11 = this;
                  uVar9 = local_78;
                } while (uVar19 < uVar13 + 1);
              }
              uVar13 = (uint)uVar16;
              local_98 = local_98 + 1;
              pvVar6 = local_50;
              local_9c = uVar18;
            } while (local_98 < local_a0);
          }
          this->Q[uVar9][local_a0] = dVar20;
          this->lastChpt[uVar9][local_a0] = local_9c;
          this->lastIndState[uVar9][local_a0] = uVar13;
          uVar9 = uVar9 + 1;
          uVar16 = local_80;
          uVar13 = local_a0;
        } while (uVar9 != local_80);
      }
      local_a0 = uVar13 + 1;
    } while (local_a0 < (uint)local_58);
    dVar20 = (double)uVar17 + (double)uVar17;
  }
  this->pruning =
       dVar20 / ((double)((int)local_68 - 1) *
                (double)(local_68 & 0xffffffff) *
                (double)(uVar16 & 0xffffffff) * (double)(uVar16 & 0xffffffff));
  operator_delete__(pvVar6);
  operator_delete__(pvVar7);
  return;
}

Assistant:

void OmegaOP::algoChannel(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  //////////////////////////////////////////////////
  /// CHANNEL INFORMATION
  /// u1 / u2 = "min / max" in each column of Q
  unsigned int* u1 = new unsigned int[n + 1];
  unsigned int* u2 = new unsigned int[n + 1];
  unsigned int theStart;
  unsigned int theEnd;
  double theV = 0;
  unsigned int indexTheV = 0;
  unsigned int nbPosition = 0;

  ///
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    /// FILL u1 and u2 vectors in position T-1
    theStart = 0;
    while(theStart < (p - 1) && Q[theStart][T - 1] > Q[theStart + 1][T - 1])
      {theStart = theStart + 1;}
    u1[T-1] = theStart;
    theEnd = p - 1;
    while(theEnd > 0 && Q[theEnd][T - 1] > Q[theEnd - 1][T - 1])
      {theEnd = theEnd - 1;}
    u2[T-1] = theEnd;

    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        ///// FIND the minimum of the cost in start state
        if(t < (T-1))
        {
          theV = cost.vhat(states[v], t, T, S12P[0][t], S12P[0][T], S12P[2][t], S12P[2][T]);
          indexTheV = cost.closestStateIndex(theV, states, p);
        }
        else
        {
          indexTheV = u1[T-1]; // if t = T-1 cost.slopeCost does not depend on u
        }

        /// explore values (in column of states) ONLY between min(u1[t],indexTheV) and max(u2[t],indexTheV)
        for(unsigned int u = std::min(u1[t],indexTheV); u < std::max(u2[t],indexTheV) + 1; u++)
        {
          nbPosition = nbPosition + 1; //we explore +1 position
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }
      }

      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }

  pruning = 2.0*nbPosition/(1.0*p*p*n*(n-1)); //nbPosition seen / nbPosition total

  delete [] u1;
  u1 = NULL;
  delete [] u2;
  u2 = NULL;
}